

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testutil.h
# Opt level: O1

void testutil_random_fe_non_zero(secp256k1_fe *nz)

{
  uint64_t *t;
  
  do {
    testutil_random_fe(nz);
  } while (((nz->n[3] == 0 && nz->n[1] == 0) && (nz->n[2] == 0 && nz->n[0] == 0)) && nz->n[4] == 0);
  return;
}

Assistant:

static void testutil_random_fe_non_zero(secp256k1_fe *nz) {
    do {
        testutil_random_fe(nz);
    } while (secp256k1_fe_is_zero(nz));
}